

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureUnitTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::TextureUnitTests::init(TextureUnitTests *this,EVP_PKEY_CTX *ctx)

{
  Context *context;
  int in_EAX;
  uint uVar1;
  TestNode *node;
  TestNode *pTVar2;
  TextureUnitCase *this_00;
  char *name;
  CaseType caseType;
  long lVar3;
  uint local_8c;
  allocator<char> local_85;
  int numUnits;
  TestNode *local_80;
  TestNode *local_78;
  string local_70;
  string countGroupName;
  
  lVar3 = 0;
  local_80 = (TestNode *)this;
LAB_0105820c:
  if (lVar3 == 4) {
    return in_EAX;
  }
  numUnits = deqp::gles2::Functional::TextureUnitTests::init::unitCounts[lVar3];
  if (lVar3 == 3) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"all",&local_85);
  }
  else {
    de::toString<int>(&local_70,&numUnits);
  }
  std::operator+(&countGroupName,&local_70,"_units");
  std::__cxx11::string::~string((string *)&local_70);
  node = (TestNode *)operator_new(0x70);
  pTVar2 = local_80;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,local_80->m_testCtx,countGroupName._M_dataplus._M_p,
             glcts::fixed_sample_locations_values + 1);
  tcu::TestNode::addChild(pTVar2,node);
  caseType = CASE_ONLY_2D;
  local_78 = node;
  do {
    name = "only_2d";
    switch(caseType) {
    case CASE_ONLY_2D:
      break;
    case CASE_ONLY_CUBE:
      name = "only_cube";
      break;
    case CASE_ONLY_2D_ARRAY:
      name = "only_2d_array";
      break;
    case CASE_ONLY_3D:
      name = "only_3d";
      break;
    default:
      name = "mixed";
      break;
    case CASE_LAST:
      goto switchD_010582d4_caseD_5;
    }
    pTVar2 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar2,local_80->m_testCtx,name,
               glcts::fixed_sample_locations_values + 1);
    tcu::TestNode::addChild(local_78,pTVar2);
    for (local_8c = 0; (int)local_8c < 10; local_8c = local_8c + 1) {
      this_00 = (TextureUnitCase *)operator_new(0x158);
      context = (Context *)local_80[1]._vptr_TestNode;
      de::toString<int>(&local_70,(int *)&local_8c);
      uVar1 = (local_8c >> 0x10 ^ local_8c ^ 0x3d) * 9;
      uVar1 = (uVar1 >> 4 ^ uVar1) * 0x27d4eb2d;
      TextureUnitCase::TextureUnitCase
                (this_00,context,local_70._M_dataplus._M_p,glcts::fixed_sample_locations_values + 1,
                 numUnits,caseType,uVar1 >> 0xf ^ uVar1);
      tcu::TestNode::addChild(pTVar2,(TestNode *)this_00);
      std::__cxx11::string::~string((string *)&local_70);
    }
    caseType = caseType + CASE_ONLY_CUBE;
  } while( true );
switchD_010582d4_caseD_5:
  in_EAX = std::__cxx11::string::~string((string *)&countGroupName);
  lVar3 = lVar3 + 1;
  goto LAB_0105820c;
}

Assistant:

void TextureUnitTests::init (void)
{
	const int numTestsPerGroup = 10;

	static const int unitCounts[] =
	{
		2,
		4,
		8,
		-1 // \note Negative stands for the implementation-specified maximum.
	};

	for (int unitCountNdx = 0; unitCountNdx < DE_LENGTH_OF_ARRAY(unitCounts); unitCountNdx++)
	{
		int numUnits = unitCounts[unitCountNdx];

		string countGroupName = (unitCounts[unitCountNdx] < 0 ? "all" : de::toString(numUnits)) + "_units";

		tcu::TestCaseGroup* countGroup = new tcu::TestCaseGroup(m_testCtx, countGroupName.c_str(), "");
		addChild(countGroup);

		DE_STATIC_ASSERT((int)TextureUnitCase::CASE_ONLY_2D == 0);

		for (int caseType = (int)TextureUnitCase::CASE_ONLY_2D; caseType < (int)TextureUnitCase::CASE_LAST; caseType++)
		{
			const char* caseTypeGroupName = (TextureUnitCase::CaseType)caseType == TextureUnitCase::CASE_ONLY_2D		? "only_2d"
										  : (TextureUnitCase::CaseType)caseType == TextureUnitCase::CASE_ONLY_CUBE		? "only_cube"
										  : (TextureUnitCase::CaseType)caseType == TextureUnitCase::CASE_ONLY_2D_ARRAY	? "only_2d_array"
										  : (TextureUnitCase::CaseType)caseType == TextureUnitCase::CASE_ONLY_3D		? "only_3d"
										  : (TextureUnitCase::CaseType)caseType == TextureUnitCase::CASE_MIXED			? "mixed"
										  : DE_NULL;

			DE_ASSERT(caseTypeGroupName != DE_NULL);

			tcu::TestCaseGroup* caseTypeGroup = new tcu::TestCaseGroup(m_testCtx, caseTypeGroupName, "");
			countGroup->addChild(caseTypeGroup);

			for (int testNdx = 0; testNdx < numTestsPerGroup; testNdx++)
				caseTypeGroup->addChild(new TextureUnitCase(m_context, de::toString(testNdx).c_str(), "", numUnits, (TextureUnitCase::CaseType)caseType, deUint32Hash((deUint32)testNdx)));
		}
	}
}